

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_utilities.hpp
# Opt level: O3

size_t Disa::pseudo_peripheral_vertex<Disa::Adjacency_Subgraph>
                 (Adjacency_Subgraph *graph,size_t i_start)

{
  pointer puVar1;
  pointer puVar2;
  char *pcVar3;
  _Alloc_hider _Var4;
  Adjacency_Graph<false> *this;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  long lVar9;
  ostream *poVar10;
  source_location *in_RCX;
  _Alloc_hider _Var11;
  bool bVar12;
  size_type sVar13;
  char *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  size_type local_48;
  undefined **local_40;
  Adjacency_Graph<false> *local_38;
  
  uVar5 = (long)(graph->graph).offset.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(graph->graph).offset.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_70 = (char *)i_start;
  if ((uVar5 == 0) || (uVar5 < 9)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_40 = &PTR_s__workspace_llm4binary_github_lic_00160d58;
    console_format_abi_cxx11_(&local_68,(Disa *)0x0,(Log_Level)&local_40,in_RCX);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"The parsed graph is empty.",0x1a);
    std::endl<char,std::char_traits<char>>(poVar10);
  }
  else {
    if (i_start < ((long)uVar5 >> 3) - 1U) {
      sVar6 = Adjacency_Graph<false>::degree(&graph->graph,(size_t *)&local_70);
      if (sVar6 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        local_40 = &PTR_s__workspace_llm4binary_github_lic_00160d88;
        console_format_abi_cxx11_(&local_68,(Disa *)0x1,(Log_Level)&local_40,in_RCX);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_68._M_dataplus._M_p,
                             local_68._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10,"The parsed start vertex has a 0 degree.",0x27);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        uVar5 = 0;
        _Var11._M_p = (char *)0x0;
        sVar13 = 0;
        local_38 = &graph->graph;
        do {
          level_traversal<Disa::Adjacency_Subgraph>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,graph,
                     (size_t)local_70,0xffffffffffffffff);
          _Var4._M_p = local_68._M_dataplus._M_p;
          local_48 = local_68.field_2._M_allocated_capacity;
          local_68._M_dataplus._M_p = (pointer)0x0;
          local_68._M_string_length = 0;
          local_68.field_2._M_allocated_capacity = 0;
          if ((_Var11._M_p != (char *)0x0) &&
             (operator_delete(_Var11._M_p,sVar13 - (long)_Var11._M_p),
             local_68._M_dataplus._M_p != (pointer)0x0)) {
            operator_delete(local_68._M_dataplus._M_p,
                            local_68.field_2._M_allocated_capacity - (long)local_68._M_dataplus._M_p
                           );
          }
          this = local_38;
          local_68._M_dataplus._M_p = (char *)0x0;
          puVar1 = (graph->graph).offset.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          puVar2 = (graph->graph).offset.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((puVar1 == puVar2) || ((long)puVar1 - (long)puVar2 == 8)) {
            if (_Var4._M_p == (char *)0x0) {
              return (size_t)local_70;
            }
            break;
          }
          bVar12 = true;
          do {
            uVar7 = *(ulong *)(_Var4._M_p + (long)local_68._M_dataplus._M_p * 8);
            if (uVar5 < uVar7) {
LAB_0011703d:
              bVar12 = false;
              uVar5 = uVar7;
              local_70 = local_68._M_dataplus._M_p;
            }
            else if (uVar7 == uVar5) {
              sVar6 = Adjacency_Graph<false>::degree(this,(size_t *)&local_68);
              sVar8 = Adjacency_Graph<false>::degree(this,(size_t *)&local_70);
              if (sVar6 < sVar8) {
                uVar7 = *(ulong *)(_Var4._M_p + (long)local_68._M_dataplus._M_p * 8);
                goto LAB_0011703d;
              }
            }
            local_68._M_dataplus._M_p = local_68._M_dataplus._M_p + 1;
            lVar9 = (long)(graph->graph).offset.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(graph->graph).offset.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start;
          } while ((lVar9 != 0) && (local_68._M_dataplus._M_p < (char *)((lVar9 >> 3) - 1U)));
          _Var11._M_p = _Var4._M_p;
          sVar13 = local_48;
        } while (!bVar12);
        pcVar3 = local_70;
        operator_delete(_Var4._M_p,local_48 - (long)_Var4._M_p);
        local_70 = pcVar3;
      }
      return (size_t)local_70;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_40 = &PTR_s__workspace_llm4binary_github_lic_00160d70;
    console_format_abi_cxx11_(&local_68,(Disa *)0x0,(Log_Level)&local_40,in_RCX);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"The parsed start vertex is not in the graph.",0x2c);
    std::endl<char,std::char_traits<char>>(poVar10);
  }
  std::__cxx11::string::~string((string *)&local_68);
  exit(1);
}

Assistant:

std::size_t pseudo_peripheral_vertex(const _graph& graph, std::size_t i_start = 0) {

  ASSERT_DEBUG(!graph.empty(), "The parsed graph is empty.");
  ASSERT_DEBUG(i_start < graph.size_vertex(), "The parsed start vertex is not in the graph.");
  if(graph.degree(i_start) == 0) {
    WARNING("The parsed start vertex has a 0 degree.");
    return i_start;
  }

  // Calculate the distance of each vertex from the starting vertex
  bool found = false;
  std::size_t max_distance = 0;
  std::size_t& pseudo_peripheral_node = i_start;
  std::vector<std::size_t> distance;

  // Calculate the eccentricity of each vertex
  while(!found) {
    found = true;
    distance = level_traversal(graph, pseudo_peripheral_node);
    FOR(i_vertex, graph.size_vertex()) {
      if(distance[i_vertex] > max_distance ||
         (distance[i_vertex] == max_distance && graph.degree(i_vertex) < graph.degree(pseudo_peripheral_node))) {
        max_distance = distance[i_vertex];
        pseudo_peripheral_node = i_vertex;
        found = false;
      }
    }
  }
  return pseudo_peripheral_node;
}